

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::setRootType
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr type)

{
  SourceFile *pSVar1;
  StructSchema SVar2;
  char *errorMessage;
  StringPtr name;
  Fault f;
  NullableValue<capnp::Schema> schema;
  undefined1 local_58 [64];
  
  pSVar1 = (this->sourceFiles).builder.ptr;
  if ((long)(this->sourceFiles).builder.pos - (long)pSVar1 != 0x20) {
    kj::_::Debug::Fault::Fault
              ((Fault *)local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnp.c++"
               ,0x48f,FAILED,"sourceFiles.size() == 1","");
    kj::_::Debug::Fault::fatal((Fault *)local_58);
  }
  name.content.size_ = (size_t)type.content.ptr;
  name.content.ptr = (char *)pSVar1->id;
  resolveName((CompilerMain *)local_58,(uint64_t)this,name);
  local_58[0x30] = local_58[0];
  if (local_58[0] == '\x01') {
    local_58._56_8_ = local_58._8_8_;
    Schema::getProto((Reader *)local_58,(Schema *)(local_58 + 0x38));
    if ((0x6f < (uint)local_58._32_4_) &&
       (*(short *)((long)&((Disposer *)(local_58._16_8_ + 8))->_vptr_Disposer + 4) == 1)) {
      SVar2 = Schema::asStruct((Schema *)(local_58 + 0x38));
      (this->rootType).super_Schema.raw = (RawBrandedSchema *)SVar2.super_Schema.raw;
      (__return_storage_ptr__->errorMessage).ptr.isSet = false;
      return __return_storage_ptr__;
    }
    errorMessage = "not a struct type";
  }
  else {
    errorMessage = "no such type";
  }
  kj::MainBuilder::Validity::Validity(__return_storage_ptr__,errorMessage);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity setRootType(kj::StringPtr type) {
    KJ_ASSERT(sourceFiles.size() == 1);

    KJ_IF_MAYBE(schema, resolveName(sourceFiles[0].id, type)) {
      if (schema->getProto().which() != schema::Node::STRUCT) {
        return "not a struct type";
      }
      rootType = schema->asStruct();
      return true;
    } else {
      return "no such type";
    }
  }